

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOptimizedPixelReading.h
# Opt level: O0

void Imf_2_5::writeToRGBANormal
               (unsigned_short **readPtrRed,unsigned_short **readPtrGreen,
               unsigned_short **readPtrBlue,unsigned_short **readPtrAlpha,unsigned_short **writePtr,
               size_t *lPixelsToCopy)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  size_t i;
  size_t *lPixelsToCopy_local;
  unsigned_short **writePtr_local;
  unsigned_short **readPtrAlpha_local;
  unsigned_short **readPtrBlue_local;
  unsigned_short **readPtrGreen_local;
  unsigned_short **readPtrRed_local;
  
  for (i = 0; i < *lPixelsToCopy; i = i + 1) {
    puVar2 = *readPtrRed;
    *readPtrRed = puVar2 + 1;
    uVar1 = *puVar2;
    puVar2 = *writePtr;
    *writePtr = puVar2 + 1;
    *puVar2 = uVar1;
    puVar2 = *readPtrGreen;
    *readPtrGreen = puVar2 + 1;
    uVar1 = *puVar2;
    puVar2 = *writePtr;
    *writePtr = puVar2 + 1;
    *puVar2 = uVar1;
    puVar2 = *readPtrBlue;
    *readPtrBlue = puVar2 + 1;
    uVar1 = *puVar2;
    puVar2 = *writePtr;
    *writePtr = puVar2 + 1;
    *puVar2 = uVar1;
    puVar2 = *readPtrAlpha;
    *readPtrAlpha = puVar2 + 1;
    uVar1 = *puVar2;
    puVar2 = *writePtr;
    *writePtr = puVar2 + 1;
    *puVar2 = uVar1;
  }
  return;
}

Assistant:

EXR_FORCEINLINE 
void writeToRGBANormal (unsigned short*& readPtrRed,
                        unsigned short*& readPtrGreen,
                        unsigned short*& readPtrBlue,
                        unsigned short*& readPtrAlpha,
                        unsigned short*& writePtr,
                        const size_t& lPixelsToCopy)
{
    for (size_t i = 0; i < lPixelsToCopy; ++i)
    {
        *(writePtr++) = *(readPtrRed++);
        *(writePtr++) = *(readPtrGreen++);
        *(writePtr++) = *(readPtrBlue++);
        *(writePtr++) = *(readPtrAlpha++);
    }
}